

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table.cc
# Opt level: O1

void ** __thiscall tcmalloc::StackTraceTable::ReadStackTracesAndClear(StackTraceTable *this)

{
  void *pvVar1;
  StackTrace *pSVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void **ppvVar6;
  ulong uVar7;
  int iVar8;
  Entry *head_1;
  Entry *head;
  Entry *pEVar9;
  void *pvVar10;
  int iVar11;
  size_t size;
  Entry *pEVar12;
  bool bVar13;
  SpinLockHolder local_28;
  SpinLockHolder h;
  
  pEVar12 = this->head_;
  if (pEVar12 == (Entry *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar8 = 0;
    pEVar9 = pEVar12;
    iVar3 = 0;
    do {
      iVar11 = iVar3;
      pSVar2 = &pEVar9->trace;
      pEVar9 = pEVar9->next;
      iVar4 = (int)pSVar2->depth;
      iVar8 = iVar8 + 3;
      iVar3 = iVar11 + iVar4;
    } while (pEVar9 != (Entry *)0x0);
    iVar4 = iVar11 + iVar8 + iVar4;
  }
  size = 0xffffffffffffffff;
  if (-2 < iVar4) {
    size = (long)iVar4 * 8 + 8;
  }
  ppvVar6 = (void **)operator_new__(size);
  uVar7 = 0;
  if (pEVar12 != (Entry *)0x0) {
    do {
      pEVar9 = pEVar12->next;
      iVar4 = (int)uVar7;
      ppvVar6[iVar4] = (void *)0x1;
      ppvVar6[(long)iVar4 + 1] = (void *)(pEVar12->trace).size;
      pvVar1 = (void *)(pEVar12->trace).depth;
      uVar5 = iVar4 + 3;
      ppvVar6[(long)iVar4 + 2] = pvVar1;
      if (pvVar1 != (void *)0x0) {
        pvVar10 = (void *)0x0;
        do {
          ppvVar6[(long)(int)uVar5 + (long)pvVar10] = (pEVar12->trace).stack[(long)pvVar10];
          pvVar10 = (void *)((long)pvVar10 + 1);
        } while (pvVar1 != pvVar10);
        uVar5 = uVar5 + (int)pvVar10;
      }
      uVar7 = (ulong)uVar5;
      pEVar12 = pEVar9;
    } while (pEVar9 != (Entry *)0x0);
    uVar7 = (ulong)(int)uVar5;
  }
  ppvVar6[uVar7] = (void *)0x0;
  this->error_ = false;
  local_28.lock_ = (SpinLock *)(Static::pageheap_ + 8);
  LOCK();
  bVar13 = Static::pageheap_._8_4_ == 0;
  if (bVar13) {
    Static::pageheap_._8_4_ = 1;
  }
  UNLOCK();
  if (!bVar13) {
    SpinLock::SlowLock((SpinLock *)(Static::pageheap_ + 8));
  }
  pEVar12 = this->head_;
  while (pEVar9 = pEVar12, pEVar9 != (Entry *)0x0) {
    pEVar12 = pEVar9->next;
    pEVar9->next = (Entry *)STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void>::
                            underlying_.allocator.free_list_;
    STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void>::underlying_.allocator.inuse_ =
         STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void>::underlying_.allocator.inuse_
         + -1;
    STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void>::underlying_.allocator.free_list_ =
         pEVar9;
  }
  this->head_ = (Entry *)0x0;
  SpinLockHolder::~SpinLockHolder(&local_28);
  return ppvVar6;
}

Assistant:

void** StackTraceTable::ReadStackTracesAndClear() {
  std::unique_ptr<void*[]> out = ProduceStackTracesDump(
    +[] (const void** current_head) -> const StackTrace* {
      const Entry* head = static_cast<const Entry*>(*current_head);
      *current_head = head->next;
      return &head->trace;
    }, head_);

  // Clear state
  error_ = false;

  SpinLockHolder h(Static::pageheap_lock());
  Entry* entry = head_;
  while (entry != nullptr) {
    Entry* next = entry->next;
    allocator_.deallocate(entry, 1);
    entry = next;
  }
  head_ = nullptr;

  return out.release();
}